

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O3

void __thiscall tf::TFProfObserver::Summary::dump_wsum(Summary *this,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  size_t sVar3;
  long lVar4;
  char *__s;
  long lVar5;
  pointer pWVar6;
  size_t max_w;
  size_t l_w;
  size_t c_w;
  size_t min_w;
  size_t avg_w;
  size_t d_w;
  char local_89;
  long local_88;
  long local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  pointer local_38;
  
  local_80 = 5;
  local_58 = 5;
  local_40 = 9;
  local_48 = 8;
  local_50 = 8;
  local_88 = 8;
  std::
  for_each<__gnu_cxx::__normal_iterator<tf::TFProfObserver::WorkerSummary_const*,std::vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>>,tf::TFProfObserver::Summary::dump_wsum(std::ostream&)const::_lambda(auto:1_const&)_1_>
            ((this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_ba1d5cc4)&local_80);
  std::
  for_each<__gnu_cxx::__normal_iterator<tf::TFProfObserver::WorkerSummary_const*,std::vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>>,tf::TFProfObserver::Summary::dump_wsum(std::ostream&)const::_lambda(auto:1_const&)_2_>
            ((this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_ba1d3afb)&local_58);
  std::
  for_each<__gnu_cxx::__normal_iterator<tf::TFProfObserver::WorkerSummary_const*,std::vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>>,tf::TFProfObserver::Summary::dump_wsum(std::ostream&)const::_lambda(auto:1_const&)_3_>
            ((this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_ba1d3ebc)&local_40);
  std::
  for_each<__gnu_cxx::__normal_iterator<tf::TFProfObserver::WorkerSummary_const*,std::vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>>,tf::TFProfObserver::Summary::dump_wsum(std::ostream&)const::_lambda(auto:1_const&)_4_>
            ((this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_a7a8096a)&local_48);
  std::
  for_each<__gnu_cxx::__normal_iterator<tf::TFProfObserver::WorkerSummary_const*,std::vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>>,tf::TFProfObserver::Summary::dump_wsum(std::ostream&)const::_lambda(auto:1_const&)_5_>
            ((this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_a84b54ea)&local_50);
  std::
  for_each<__gnu_cxx::__normal_iterator<tf::TFProfObserver::WorkerSummary_const*,std::vector<tf::TFProfObserver::WorkerSummary,std::allocator<tf::TFProfObserver::WorkerSummary>>>,tf::TFProfObserver::Summary::dump_wsum(std::ostream&)const::_lambda(auto:1_const&)_6_>
            ((this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_a847d77c)&local_88);
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 10;
  std::__ostream_insert<char,std::char_traits<char>>(os,"-Worker-",8);
  *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = (long)((int)local_80 + 2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Level",5);
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 10;
  std::__ostream_insert<char,std::char_traits<char>>(os,"Task",4);
  *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = (long)((int)local_58 + 2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Count",5);
  *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = (long)((int)local_40 + 2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Time (us)",9);
  *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = (long)((int)local_48 + 2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Avg (us)",8);
  *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = (long)((int)local_50 + 2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Min (us)",8);
  *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = (long)((int)local_88 + 2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"Max (us)",8);
  local_78._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_78,1);
  pWVar6 = (this->wsum).
           super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->wsum).
             super__Vector_base<tf::TFProfObserver::WorkerSummary,_std::allocator<tf::TFProfObserver::WorkerSummary>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pWVar6 != local_38) {
    do {
      if (pWVar6->count != 0) {
        *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 10;
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
        *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) =
             (local_80 << 0x20) + 0x200000000 >> 0x20;
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        bVar1 = true;
        lVar5 = 0;
        do {
          if ((&(pWVar6->tsum)._M_elems[0].count)[lVar5] != 0) {
            lVar4 = (long)((int)local_80 + 0x16);
            if (bVar1) {
              lVar4 = 10;
            }
            *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = lVar4;
            __s = "undefined";
            if ((ulong)*(uint *)((long)&TASK_TYPES + lVar5) < 7) {
              __s = (&PTR_anon_var_dwarf_353e7_00117d20)[*(uint *)((long)&TASK_TYPES + lVar5)];
            }
            sVar3 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar3);
            *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) =
                 (local_58 << 0x20) + 0x200000000 >> 0x20;
            poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
            *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) =
                 (local_40 << 0x20) + 0x200000000 >> 0x20;
            poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
            *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) =
                 (local_48 << 0x20) + 0x200000000 >> 0x20;
            __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                      (&local_78,vsnprintf,0x3a,"%f",
                       (double)((float)(&(pWVar6->tsum)._M_elems[0].total_span)[lVar5] /
                               (float)(&(pWVar6->tsum)._M_elems[0].count)[lVar5]));
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar2,(char *)CONCAT71(local_78._M_dataplus._M_p._1_7_,
                                                        local_78._M_dataplus._M_p._0_1_),
                                local_78._M_string_length);
            *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) =
                 (local_50 << 0x20) + 0x200000000 >> 0x20;
            poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
            *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) =
                 (local_88 << 0x20) + 0x200000000 >> 0x20;
            poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
            local_89 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_89,1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_) !=
                &local_78.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_78._M_dataplus._M_p._1_7_,
                                       local_78._M_dataplus._M_p._0_1_),
                              local_78.field_2._M_allocated_capacity + 1);
            }
            bVar1 = false;
          }
          lVar5 = lVar5 + 4;
        } while (lVar5 != 0x1c);
        *(long *)(os + *(long *)(*(long *)os + -0x18) + 0x10) =
             (long)((int)local_80 + (int)local_58 + 0x18);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
        *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) =
             (local_40 << 0x20) + 0x200000000 >> 0x20;
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) =
             (local_48 << 0x20) + 0x200000000 >> 0x20;
        __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                  (&local_78,vsnprintf,0x3a,"%f",
                   (double)((float)pWVar6->total_span / (float)pWVar6->count));
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(char *)CONCAT71(local_78._M_dataplus._M_p._1_7_,
                                                    local_78._M_dataplus._M_p._0_1_),
                            local_78._M_string_length);
        *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) =
             (local_50 << 0x20) + 0x200000000 >> 0x20;
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) =
             (local_88 << 0x20) + 0x200000000 >> 0x20;
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        local_89 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_89,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_78._M_dataplus._M_p._1_7_,local_78._M_dataplus._M_p._0_1_),
                          local_78.field_2._M_allocated_capacity + 1);
        }
      }
      pWVar6 = pWVar6 + 1;
    } while (pWVar6 != local_38);
  }
  return;
}

Assistant:

inline void TFProfObserver::Summary::dump_wsum(std::ostream& os) const {
  
  // task summary
  size_t w_w{10}, t_w{10}, l_w{5}, c_w{5}, d_w{9}, avg_w{8}, min_w{8}, max_w{8};

  std::for_each(wsum.begin(), wsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    l_w = (std::max)(l_w, std::to_string(i.level).size());
  });
  
  std::for_each(wsum.begin(), wsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    c_w = (std::max)(c_w, std::to_string(i.count).size());
  });
  
  std::for_each(wsum.begin(), wsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    d_w = (std::max)(d_w, std::to_string(i.total_span).size());
  });
  
  std::for_each(wsum.begin(), wsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    avg_w = (std::max)(avg_w, std::to_string(i.avg_span()).size());
  });
  
  std::for_each(wsum.begin(), wsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    min_w = (std::max)(min_w, std::to_string(i.min_span).size());
  });
  
  std::for_each(wsum.begin(), wsum.end(), [&](const auto& i){
    if(i.count == 0) return;
    max_w = (std::max)(max_w, std::to_string(i.max_span).size());
  });
  
  os << std::setw(w_w) << "-Worker-" 
     << std::setw(l_w+2) << "Level"
     << std::setw(t_w) << "Task"
     << std::setw(c_w+2) << "Count"
     << std::setw(d_w+2) << "Time (us)"
     << std::setw(avg_w+2) << "Avg (us)"
     << std::setw(min_w+2) << "Min (us)"
     << std::setw(max_w+2) << "Max (us)"
     << '\n';

  for(const auto& ws : wsum) {

    if(ws.count == 0) {
      continue;
    }

    os << std::setw(w_w) << ws.id
       << std::setw(l_w+2) << ws.level;
    
    bool first = true;
    for(size_t i=0; i<TASK_TYPES.size(); i++) {

      if(ws.tsum[i].count == 0) {
        continue;
      }

      os << (first ? std::setw(t_w) : std::setw(w_w + l_w + 2 + t_w));
      first = false;

      os << to_string(TASK_TYPES[i])
         << std::setw(c_w+2) << ws.tsum[i].count
         << std::setw(d_w+2) << ws.tsum[i].total_span
         << std::setw(avg_w+2) << std::to_string(ws.tsum[i].avg_span())
         << std::setw(min_w+2) << ws.tsum[i].min_span
         << std::setw(max_w+2) << ws.tsum[i].max_span
         << '\n';
    }

    // per-worker summary
    os << std::setw(w_w + l_w + t_w + c_w + 4) << ws.count
       << std::setw(d_w+2) << ws.total_span
       << std::setw(avg_w+2) << std::to_string(ws.avg_span())
       << std::setw(min_w+2) << ws.min_span
       << std::setw(max_w+2) << ws.max_span
       << '\n';
    
    //for(size_t j=0; j<w_w+l_w+t_w+4; j++) os << ' ';
    //for(size_t j=0; j<c_w+d_w+avg_w+min_w+max_w+8; j++) os << '-';
    //os <<'\n';
  }
}